

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

void __thiscall Thread::Thread(Thread *this)

{
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  this->_vptr_Thread = (_func_int **)&PTR__Thread_001906d0;
  this->mAutoDelete = false;
  (this->mMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mMutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mMutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->mRunning = false;
  EventLoop::eventLoop();
  (this->mLoop).super___weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_20;
  (this->mLoop).super___weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_18
  ;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_weak_count = local_18->_M_weak_count + 1;
      UNLOCK();
      if (local_18 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
    }
    else {
      local_18->_M_weak_count = local_18->_M_weak_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

Thread::Thread()
    : mAutoDelete(false), mRunning(false), mLoop(EventLoop::eventLoop())
{
}